

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O2

void __thiscall PatternModel::removeOrder(PatternModel *this)

{
  OrderRemoveCmd *this_00;
  QUndoStack *pQVar1;
  QArrayDataPointer<char16_t> QStack_48;
  QArrayDataPointer<char16_t> local_30;
  
  this_00 = (OrderRemoveCmd *)operator_new(0x20);
  OrderRemoveCmd::OrderRemoveCmd(this_00,this,this->mCursorPattern);
  tr((QString *)&local_30,"remove order #%1",(char *)0x0,-1);
  QString::arg((QString *)&QStack_48,(QString *)&local_30,this->mCursorPattern,0,10,(QChar)0x20);
  QUndoCommand::setText((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar1 = Module::undoStack(this->mModule);
  QUndoStack::push((QUndoCommand *)pQVar1);
  return;
}

Assistant:

void PatternModel::removeOrder() {
    auto cmd = new OrderRemoveCmd(*this, mCursorPattern);
    cmd->setText(tr("remove order #%1").arg(mCursorPattern));
    mModule.undoStack()->push(cmd);
}